

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpstack.cc
# Opt level: O0

void __thiscall UdpStack::UdpStack(UdpStack *this,int testmode,sockaddr_in *local)

{
  undefined8 uVar1;
  in_port_t iVar2;
  in_addr iVar3;
  ostream *poVar4;
  LossyUdpLayer *this_00;
  RestrictedUdpLayer *this_01;
  TimedUdpLayer *this_02;
  sockaddr_in *local_local;
  int testmode_local;
  UdpStack *this_local;
  
  UdpReceiver::UdpReceiver(&this->super_UdpReceiver);
  UdpPublisher::UdpPublisher(&this->super_UdpPublisher);
  (this->super_UdpReceiver)._vptr_UdpReceiver = (_func_int **)&PTR__UdpStack_001a57d8;
  (this->super_UdpPublisher)._vptr_UdpPublisher = (_func_int **)&DAT_001a5810;
  this->udpLayer = (UdpLayer *)0x0;
  bdMutex::bdMutex(&this->stackMtx,false);
  iVar2 = local->sin_port;
  iVar3.s_addr = (local->sin_addr).s_addr;
  uVar1 = *(undefined8 *)local->sin_zero;
  (this->laddr).sin_family = local->sin_family;
  (this->laddr).sin_port = iVar2;
  (this->laddr).sin_addr = (in_addr)iVar3.s_addr;
  *(undefined8 *)(this->laddr).sin_zero = uVar1;
  std::__cxx11::list<UdpReceiver_*,_std::allocator<UdpReceiver_*>_>::list(&this->mReceivers);
  poVar4 = std::operator<<((ostream *)&std::cerr,"UdpStack::UdpStack() Evoked in TestMode");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (testmode == 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"UdpStack::UdpStack() Installing LossyUdpLayer");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_00 = (LossyUdpLayer *)operator_new(0xa0);
    LossyUdpLayer::LossyUdpLayer(this_00,&this->super_UdpReceiver,&this->laddr,0.1);
    this->udpLayer = (UdpLayer *)this_00;
  }
  else if (testmode == 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "UdpStack::UdpStack() Installing RestrictedUdpLayer");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_01 = (RestrictedUdpLayer *)operator_new(0xb0);
    RestrictedUdpLayer::RestrictedUdpLayer(this_01,&this->super_UdpReceiver,&this->laddr);
    this->udpLayer = (UdpLayer *)this_01;
  }
  else if (testmode == 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"UdpStack::UdpStack() Installing TimedUdpLayer");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_02 = (TimedUdpLayer *)operator_new(0xa8);
    TimedUdpLayer::TimedUdpLayer(this_02,&this->super_UdpReceiver,&this->laddr);
    this->udpLayer = (UdpLayer *)this_02;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "UdpStack::UdpStack() Installing Standard UdpLayer");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    openSocket(this);
  }
  return;
}

Assistant:

UdpStack::UdpStack(int testmode, struct sockaddr_in &local)
	:udpLayer(NULL),
	 laddr(local) {

	std::cerr << "UdpStack::UdpStack() Evoked in TestMode" << std::endl;
	if (testmode == UDP_TEST_LOSSY_LAYER) {
		std::cerr << "UdpStack::UdpStack() Installing LossyUdpLayer" << std::endl;
		udpLayer = new LossyUdpLayer(this, laddr, UDP_TEST_LOSSY_FRAC);
	} else if (testmode == UDP_TEST_RESTRICTED_LAYER) {
		std::cerr << "UdpStack::UdpStack() Installing RestrictedUdpLayer" << std::endl;
		udpLayer = new RestrictedUdpLayer(this, laddr);
	} else if (testmode == UDP_TEST_TIMED_LAYER) {
		std::cerr << "UdpStack::UdpStack() Installing TimedUdpLayer" << std::endl;
		udpLayer = new TimedUdpLayer(this, laddr);
	} else {
		std::cerr << "UdpStack::UdpStack() Installing Standard UdpLayer" << std::endl;
		// standard layer 
		openSocket();
	}
	return;
}